

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O2

void __thiscall
DCanvas::FillSimplePoly
          (DCanvas *this,FTexture *tex,FVector2 *points,int npoints,double originx,double originy,
          double scalex,double scaley,DAngle *rotation,FDynamicColormap *colormap,int lightlevel,
          int bottomclip)

{
  float fVar1;
  double dVar2;
  double dVar3;
  short sVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined8 uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  short sVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  double dVar19;
  lighttable_t *colormap_00;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  bool bVar27;
  float fVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  double local_a0;
  double local_90;
  double local_88;
  
  uVar9 = swrenderer::drawerargs::dc_destorg;
  if ((2 < npoints) && (this->Buffer != (BYTE *)0x0)) {
    dVar2 = rotation->Degrees;
    fVar28 = points->X;
    fVar31 = points->Y;
    uVar25 = npoints - 1;
    uVar24 = 0;
    uVar18 = 0;
    fVar33 = fVar31;
    fVar34 = fVar28;
    for (uVar14 = 1; (uint)npoints != uVar14; uVar14 = uVar14 + 1) {
      fVar32 = points[uVar14].Y;
      fVar1 = points[uVar14].X;
      if (fVar32 < fVar33) {
        uVar18 = uVar14 & 0xffffffff;
        fVar33 = fVar32;
      }
      if (fVar31 < fVar32) {
        uVar24 = uVar14 & 0xffffffff;
        fVar31 = fVar32;
      }
      fVar32 = fVar1;
      if (fVar34 <= fVar1) {
        fVar32 = fVar34;
      }
      if (fVar1 <= fVar28) {
        fVar1 = fVar28;
      }
      fVar28 = fVar1;
      fVar34 = fVar32;
    }
    uVar26 = this->Height;
    if (0 < bottomclip) {
      uVar26 = bottomclip;
    }
    if ((((fVar33 < (float)(int)uVar26) && (0.0 < fVar31)) && (fVar34 < (float)this->Width)) &&
       (0.0 < fVar28)) {
      swrenderer::drawerargs::dc_destorg = (screen->super_DSimpleCanvas).super_DCanvas.Buffer;
      uVar29 = SUB84(dVar2,0);
      uVar30 = (undefined4)((ulong)dVar2 >> 0x20);
      if (swrenderer::drawerargs::dc_destorg == (BYTE *)0x0) {
        I_FatalError("Attempt to write to buffer of hardware canvas");
        uVar29 = SUB84(rotation->Degrees,0);
        uVar30 = (undefined4)((ulong)rotation->Degrees >> 0x20);
      }
      dVar19 = (tex->Scale).X;
      dVar3 = (tex->Scale).Y;
      dVar5 = cos((double)CONCAT44(uVar30,uVar29) * 0.017453292519943295);
      dVar6 = sin(rotation->Degrees * 0.017453292519943295);
      swrenderer::R_SetupSpanBits(tex);
      if (colormap == (FDynamicColormap *)0x0) {
        colormap_00 = &swrenderer::identitymap;
      }
      else {
        uVar16 = lightlevel * -0x4000 + 0x310000 >> 0x10;
        uVar10 = 0x1f;
        if (uVar16 < 0x1f) {
          uVar10 = uVar16;
        }
        uVar14 = 0;
        if (0 < (int)uVar16) {
          uVar14 = (ulong)(uVar10 << 8);
        }
        colormap_00 = colormap->Maps + uVar14;
      }
      swrenderer::R_SetSpanColormap(colormap_00);
      swrenderer::R_SetSpanSource(tex);
      local_90 = 0.0;
      swrenderer::drawerargs::ds_ystep = 0;
      swrenderer::drawerargs::ds_xstep = 0;
      local_88 = 0.0;
      if (swrenderer::drawerargs::ds_xbits != 0) {
        local_88 = (double)(uint)(1 << (-(char)swrenderer::drawerargs::ds_xbits & 0x1fU)) /
                   (scalex / dVar19);
        swrenderer::drawerargs::ds_xstep = SUB84(dVar5 * local_88 + 1.5e-08 + 6755399441055744.0,0);
      }
      if (swrenderer::drawerargs::ds_ybits != 0) {
        local_90 = (double)(uint)(1 << (-(char)swrenderer::drawerargs::ds_ybits & 0x1fU)) /
                   (scaley / dVar3);
        swrenderer::drawerargs::ds_ystep = SUB84(dVar6 * local_90 + 1.5e-08 + 6755399441055744.0,0);
      }
      iVar23 = (int)uVar18;
      uVar10 = iVar23 + 1;
      if ((int)uVar25 <= iVar23) {
        uVar10 = 0;
      }
      local_a0 = (double)(points[iVar23].Y + 0.5) + 1.5e-08 + 6755399441055744.0;
      dVar19 = local_a0;
      uVar14 = uVar18;
      do {
        dVar3 = (double)(points[(int)uVar10].Y + 0.5) + 1.5e-08 + 6755399441055744.0;
        uVar12 = SUB84(dVar19,0);
        uVar16 = SUB84(dVar3,0);
        if (((int)uVar12 < (int)uVar16) &&
           ((int)uVar12 < (int)uVar26 && -1 < (int)(uVar12 & uVar16))) {
          uVar22 = uVar26;
          if ((int)uVar16 < (int)uVar26) {
            uVar22 = uVar16;
          }
          iVar17 = SUB84((double)((points[(int)uVar10].X - points[(int)uVar14].X) /
                                 (points[(int)uVar10].Y - points[(int)uVar14].Y)) + 103079215104.0,0
                        );
          uVar21 = 0;
          if (0 < (int)uVar12) {
            uVar21 = (ulong)dVar19 & 0xffffffff;
          }
          iVar20 = SUB84((double)(points[(int)uVar14].X + 0.5) + 103079215104.0,0) -
                   ((int)uVar12 >> 0x1f & uVar12 * iVar17);
          sVar4 = (short)this->Width;
          for (; (long)uVar21 < (long)(int)uVar22; uVar21 = uVar21 + 1) {
            sVar15 = (short)((uint)iVar20 >> 0x10);
            if (sVar4 <= sVar15) {
              sVar15 = sVar4;
            }
            if (iVar20 < 0) {
              sVar15 = -1;
            }
            spanend[uVar21] = sVar15;
            iVar20 = iVar20 + iVar17;
          }
        }
        uVar16 = uVar10 + 1;
        if ((int)uVar25 <= (int)uVar10) {
          uVar16 = 0;
        }
        uVar14 = (ulong)uVar10;
        bVar27 = uVar10 != (uint)uVar24;
        dVar19 = (double)((ulong)dVar3 & 0xffffffff);
        uVar10 = uVar16;
      } while (bVar27);
      uVar10 = iVar23 - 1;
      if (iVar23 < 1) {
        uVar10 = uVar25;
      }
      do {
        uVar14 = (ulong)uVar10;
        dVar19 = (double)(points[uVar14].Y + 0.5) + 1.5e-08 + 6755399441055744.0;
        uVar16 = SUB84(local_a0,0);
        uVar12 = SUB84(dVar19,0);
        if (((int)uVar16 < (int)uVar12) &&
           ((int)uVar16 < (int)uVar26 && -1 < (int)(uVar12 & uVar16))) {
          uVar22 = uVar26;
          if ((int)uVar12 < (int)uVar26) {
            uVar22 = uVar12;
          }
          iVar23 = SUB84((double)((points[uVar14].X - points[(int)uVar18].X) /
                                 (points[uVar14].Y - points[(int)uVar18].Y)) + 103079215104.0,0);
          uVar21 = 0;
          if (0 < (int)uVar16) {
            uVar21 = (ulong)local_a0 & 0xffffffff;
          }
          iVar17 = SUB84((double)(points[(int)uVar18].X + 0.5) + 103079215104.0,0) -
                   ((int)uVar16 >> 0x1f & uVar16 * iVar23);
          for (; (long)uVar21 < (long)(int)uVar22; uVar21 = uVar21 + 1) {
            iVar20 = (int)spanend[uVar21];
            if (((0 < spanend[uVar21]) && (iVar11 = iVar17 >> 0x10, iVar11 < iVar20)) &&
               (iVar13 = this->Width, iVar11 < iVar13)) {
              if (iVar11 < 1) {
                iVar11 = 0;
              }
              if (iVar20 < iVar13) {
                iVar13 = iVar20;
              }
              swrenderer::drawerargs::ds_x2 = iVar13 + -1;
              swrenderer::drawerargs::ds_y = (int)uVar21;
              dVar7 = (double)iVar11 - originx;
              dVar3 = (double)swrenderer::drawerargs::ds_y - originy;
              if ((dVar2 != 0.0) || (dVar8 = dVar7, NAN(dVar2))) {
                dVar8 = dVar5 * dVar7 - dVar6 * dVar3;
                dVar3 = dVar3 * dVar5 + dVar7 * dVar6;
              }
              swrenderer::drawerargs::ds_xfrac =
                   SUB84(dVar8 * local_88 + 1.5e-08 + 6755399441055744.0,0);
              swrenderer::drawerargs::ds_yfrac =
                   SUB84(dVar3 * local_90 + 1.5e-08 + 6755399441055744.0,0);
              swrenderer::drawerargs::ds_x1 = iVar11;
              swrenderer::R_DrawSpan();
            }
            iVar17 = iVar17 + iVar23;
          }
        }
        uVar16 = uVar10 - 1;
        if ((int)uVar10 < 1) {
          uVar16 = uVar25;
        }
        bVar27 = uVar10 != (uint)uVar24;
        uVar18 = uVar14;
        uVar10 = uVar16;
        local_a0 = dVar19;
      } while (bVar27);
    }
  }
  swrenderer::drawerargs::dc_destorg = (BYTE *)uVar9;
  return;
}

Assistant:

void DCanvas::FillSimplePoly(FTexture *tex, FVector2 *points, int npoints,
	double originx, double originy, double scalex, double scaley, DAngle rotation,
	FDynamicColormap *colormap, int lightlevel, int bottomclip)
{
#ifndef NO_SWRENDER
	using namespace swrenderer;
	using namespace drawerargs;

	// Use an equation similar to player sprites to determine shade
	fixed_t shade = LIGHT2SHADE(lightlevel) - 12*FRACUNIT;
	float topy, boty, leftx, rightx;
	int toppt, botpt, pt1, pt2;
	int i;
	int y1, y2, y;
	fixed_t x;
	bool dorotate = rotation != 0.;
	double cosrot, sinrot;

	if (--npoints < 2 || Buffer == NULL)
	{ // not a polygon or we're not locked
		return;
	}

	if (bottomclip <= 0)
	{
		bottomclip = Height;
	}

	// Find the extents of the polygon, in particular the highest and lowest points.
	for (botpt = toppt = 0, boty = topy = points[0].Y, leftx = rightx = points[0].X, i = 1; i <= npoints; ++i)
	{
		if (points[i].Y < topy)
		{
			topy = points[i].Y;
			toppt = i;
		}
		if (points[i].Y > boty)
		{
			boty = points[i].Y;
			botpt = i;
		}
		if (points[i].X < leftx)
		{
			leftx = points[i].X;
		}
		if (points[i].X > rightx)
		{
			rightx = points[i].X;
		}
	}
	if (topy >= bottomclip ||	// off the bottom of the screen
		boty <= 0 ||			// off the top of the screen
		leftx >= Width ||		// off the right of the screen
		rightx <= 0)			// off the left of the screen
	{
		return;
	}

	BYTE *destorgsave = dc_destorg;
	dc_destorg = screen->GetBuffer();
	if (dc_destorg == NULL)
	{
		I_FatalError("Attempt to write to buffer of hardware canvas");
	}

	scalex /= tex->Scale.X;
	scaley /= tex->Scale.Y;

	// Use the CRT's functions here.
	cosrot = cos(rotation.Radians());
	sinrot = sin(rotation.Radians());

	// Setup constant texture mapping parameters.
	R_SetupSpanBits(tex);
	R_SetSpanColormap(colormap != NULL ? &colormap->Maps[clamp(shade >> FRACBITS, 0, NUMCOLORMAPS-1) * 256] : identitymap);
	R_SetSpanSource(tex);
	if (ds_xbits != 0)
	{
		scalex = double(1u << (32 - ds_xbits)) / scalex;
		ds_xstep = xs_RoundToInt(cosrot * scalex);
	}
	else
	{ // Texture is one pixel wide.
		scalex = 0;
		ds_xstep = 0;
	}
	if (ds_ybits != 0)
	{
		scaley = double(1u << (32 - ds_ybits)) / scaley;
		ds_ystep = xs_RoundToInt(sinrot * scaley);
	}
	else
	{ // Texture is one pixel tall.
		scaley = 0;
		ds_ystep = 0;
	}

	// Travel down the right edge and create an outline of that edge.
	pt1 = toppt;
	pt2 = toppt + 1;	if (pt2 > npoints) pt2 = 0;
	y1 = xs_RoundToInt(points[pt1].Y + 0.5f);
	do
	{
		x = FLOAT2FIXED(points[pt1].X + 0.5f);
		y2 = xs_RoundToInt(points[pt2].Y + 0.5f);
		if (y1 >= y2 || (y1 < 0 && y2 < 0) || (y1 >= bottomclip && y2 >= bottomclip))
		{
		}
		else
		{
			fixed_t xinc = FLOAT2FIXED((points[pt2].X - points[pt1].X) / (points[pt2].Y - points[pt1].Y));
			int y3 = MIN(y2, bottomclip);
			if (y1 < 0)
			{
				x += xinc * -y1;
				y1 = 0;
			}
			for (y = y1; y < y3; ++y)
			{
				spanend[y] = clamp<short>(x >> FRACBITS, -1, Width);
				x += xinc;
			}
		}
		y1 = y2;
		pt1 = pt2;
		pt2++;			if (pt2 > npoints) pt2 = 0;
	} while (pt1 != botpt);

	// Travel down the left edge and fill it in.
	pt1 = toppt;
	pt2 = toppt - 1;	if (pt2 < 0) pt2 = npoints;
	y1 = xs_RoundToInt(points[pt1].Y + 0.5f);
	do
	{
		x = FLOAT2FIXED(points[pt1].X + 0.5f);
		y2 = xs_RoundToInt(points[pt2].Y + 0.5f);
		if (y1 >= y2 || (y1 < 0 && y2 < 0) || (y1 >= bottomclip && y2 >= bottomclip))
		{
		}
		else
		{
			fixed_t xinc = FLOAT2FIXED((points[pt2].X - points[pt1].X) / (points[pt2].Y - points[pt1].Y));
			int y3 = MIN(y2, bottomclip);
			if (y1 < 0)
			{
				x += xinc * -y1;
				y1 = 0;
			}
			for (y = y1; y < y3; ++y)
			{
				int x1 = x >> FRACBITS;
				int x2 = spanend[y];
				if (x2 > x1 && x2 > 0 && x1 < Width)
				{
					x1 = MAX(x1, 0);
					x2 = MIN(x2, Width);
#if 0
					memset(this->Buffer + y * this->Pitch + x1, (int)tex, x2 - x1);
#else
					ds_y = y;
					ds_x1 = x1;
					ds_x2 = x2 - 1;

					DVector2 tex(x1 - originx, y - originy);
					if (dorotate)
					{
						double t = tex.X;
						tex.X = t * cosrot - tex.Y * sinrot;
						tex.Y = tex.Y * cosrot + t * sinrot;
					}
					ds_xfrac = xs_RoundToInt(tex.X * scalex);
					ds_yfrac = xs_RoundToInt(tex.Y * scaley);

					R_DrawSpan();
#endif
				}
				x += xinc;
			}
		}
		y1 = y2;
		pt1 = pt2;
		pt2--;			if (pt2 < 0) pt2 = npoints;
	} while (pt1 != botpt);
	dc_destorg = destorgsave;
#endif
}